

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InfectorHelpers.hpp
# Opt level: O0

void __thiscall
Infector::AnyShared<concreteABC,_IA,_IB,_IC>::setPtr
          (AnyShared<concreteABC,_IA,_IB,_IC> *this,void *p)

{
  exception *ex;
  concreteABC *tp;
  void *p_local;
  AnyShared<concreteABC,_IA,_IB,_IC> *this_local;
  
  std::__shared_ptr<concreteABC,_(__gnu_cxx::_Lock_policy)2>::reset<concreteABC>
            (&(this->ist).super___shared_ptr<concreteABC,_(__gnu_cxx::_Lock_policy)2>,
             (concreteABC *)p);
  AnyShared<concreteABC,IA,IB,IC>::resolve_multiple_cast<concreteABC,IA,IB,IC>
            ((AnyShared<concreteABC,IA,IB,IC> *)this,(concreteABC *)p);
  return;
}

Assistant:

virtual void setPtr(void * p) override {
            T* tp = reinterpret_cast<T*>(p);
            try{
                ist.reset(tp);
                resolve_multiple_cast<T,Bases...>(tp);
            }catch(std::exception & ex){
                multi_solver.clear();
                throw ex;
            }catch(...){
                multi_solver.clear();
                throw ExUnkownException();
            }
        }